

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::SerializationException::SerializationException<unsigned_short,unsigned_short>
          (SerializationException *this,string *msg,unsigned_short params,unsigned_short params_1)

{
  undefined6 in_register_00000012;
  unsigned_short in_R8W;
  string local_30;
  
  Exception::ConstructMessage<unsigned_short,unsigned_short>
            (&local_30,(Exception *)msg,(string *)CONCAT62(in_register_00000012,params),params_1,
             in_R8W);
  SerializationException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit SerializationException(const string &msg, ARGS... params)
	    : SerializationException(ConstructMessage(msg, params...)) {
	}